

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O2

Saig_Tsim_t * Saig_TsiStart(Aig_Man_t *pAig)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  Saig_Tsim_t *pSVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  Aig_MmFixed_t *pAVar7;
  uint **ppuVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  
  pSVar4 = (Saig_Tsim_t *)calloc(1,0x48);
  pSVar4->pAig = pAig;
  iVar11 = ((pAig->nRegs >> 4) + 1) - (uint)((pAig->nRegs & 0xfU) == 0);
  pSVar4->nWords = iVar11;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 1000;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(8000);
  pVVar5->pArray = ppvVar6;
  pSVar4->vStates = pVVar5;
  pAVar7 = Aig_MmFixedStart(iVar11 * 4 + 8,10000);
  pSVar4->pMem = pAVar7;
  uVar9 = 4999;
  do {
    do {
      uVar1 = uVar9 + 1;
      uVar3 = uVar9 & 1;
      uVar9 = uVar1;
    } while (uVar3 != 0);
    uVar10 = 3;
    do {
      iVar11 = (int)uVar10;
      if (uVar1 < (uint)(iVar11 * iVar11)) {
        pSVar4->nBins = uVar1;
        ppuVar8 = (uint **)calloc(1,(long)(int)uVar1 << 3);
        pSVar4->pBins = ppuVar8;
        return pSVar4;
      }
      uVar2 = (ulong)uVar1 % uVar10;
      uVar10 = (ulong)(iVar11 + 2);
    } while ((int)uVar2 != 0);
  } while( true );
}

Assistant:

Saig_Tsim_t * Saig_TsiStart( Aig_Man_t * pAig )
{
    Saig_Tsim_t * p;
    p = (Saig_Tsim_t *)ABC_ALLOC( char, sizeof(Saig_Tsim_t) );
    memset( p, 0, sizeof(Saig_Tsim_t) );
    p->pAig    = pAig;
    p->nWords  = Abc_BitWordNum( 2*Aig_ManRegNum(pAig) );
    p->vStates = Vec_PtrAlloc( 1000 );
    p->pMem    = Aig_MmFixedStart( sizeof(unsigned) * p->nWords + sizeof(unsigned *), 10000 );
    p->nBins   = Abc_PrimeCudd(TSIM_MAX_ROUNDS/2);
    p->pBins   = ABC_ALLOC( unsigned *, p->nBins );
    memset( p->pBins, 0, sizeof(unsigned *) * p->nBins );
    return p;
}